

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordCase::iterate(TessCoordCase *this)

{
  float *outerLevels;
  float *innerSrc;
  ostringstream *this_00;
  SpacingMode SVar1;
  pointer log;
  RenderContext *pRVar2;
  pointer pvVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  deUint32 err;
  int iVar15;
  undefined4 extraout_var;
  long lVar16;
  pointer pTVar17;
  long lVar18;
  pointer __p;
  pointer __dest;
  size_type __n;
  pointer pvVar19;
  Surface *pSVar20;
  size_t __n_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  pointer pvVar21;
  void *__buf;
  void *__buf_00;
  char *description;
  long lVar22;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coords;
  pointer pTVar23;
  TessPrimitiveType TVar24;
  ulong uVar25;
  ulong uVar26;
  int j;
  size_t __n_01;
  undefined1 auVar27 [16];
  pointer local_570;
  long local_568;
  allocator<char> local_54a;
  allocator<char> local_549;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  tessLevelCases;
  Result tfResult;
  RandomViewport viewport;
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  caseReferences;
  Surface resVisual;
  Surface refVisual;
  undefined1 local_458 [8];
  undefined8 uStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448 [23];
  string local_2d8;
  string local_2b8;
  int inner;
  int local_294;
  int outer [3];
  int local_1fc;
  TFHandler tfHandler;
  undefined4 extraout_var_00;
  
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar25 = (ulong)dVar8;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar7),0x10,0x10,dVar8);
  dVar8 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar7 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar16 = CONCAT44(extraout_var_00,iVar7);
  uVar9 = (**(code **)(lVar16 + 0xb48))(dVar8,"u_tessLevelInner0");
  uVar10 = (**(code **)(lVar16 + 0xb48))(dVar8,"u_tessLevelInner1");
  uVar11 = (**(code **)(lVar16 + 0xb48))(dVar8,"u_tessLevelOuter0");
  uVar12 = (**(code **)(lVar16 + 0xb48))(dVar8,"u_tessLevelOuter1");
  uVar13 = (**(code **)(lVar16 + 0xb48))(dVar8,"u_tessLevelOuter2");
  uVar14 = (**(code **)(lVar16 + 0xb48))(dVar8,"u_tessLevelOuter3");
  tessLevelCases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_spacing == SPACINGMODE_EQUAL) {
    local_570 = (pointer)operator_new(0xd8);
    pTVar17 = local_570 + 9;
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = local_570;
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar17;
    memcpy(local_570,(anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases,
           0xd8);
  }
  else {
    pTVar17 = (pointer)operator_new(0xd8);
    pTVar23 = pTVar17 + 9;
    local_570 = pTVar17;
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar17;
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar17;
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar23;
    for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
      lVar18 = lVar22 * 0x18;
      local_448[0]._M_allocated_capacity =
           *(pointer *)
            ((anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases +
            lVar18 + 0x10);
      local_458 = (undefined1  [8])
                  *(pointer *)
                   ((anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases +
                   lVar18);
      uStack_450 = *(pointer *)
                    ((anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases +
                    lVar18 + 8);
      SVar1 = this->m_spacing;
      for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
        iVar7 = getClampedRoundedTessLevel(SVar1,*(float *)(local_458 + lVar18 * 4));
        *(float *)(local_458 + lVar18 * 4) = (float)iVar7;
      }
      for (lVar18 = 2; lVar18 != 6; lVar18 = lVar18 + 1) {
        iVar7 = getClampedRoundedTessLevel(SVar1,*(float *)(local_458 + lVar18 * 4));
        *(float *)(local_458 + lVar18 * 4) = (float)iVar7;
      }
      if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        if (((1.0 < (float)local_448[0]._0_4_ || (1.0 < uStack_450._4_4_ || 1.0 < (float)uStack_450)
             ) && ((float)local_458._0_4_ == 1.0)) && (!NAN((float)local_458._0_4_))) {
          iVar7 = getClampedRoundedTessLevel(SVar1,1.1);
          local_458._0_4_ = (float)iVar7;
        }
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
        auVar27._4_4_ = -(uint)(1.0 < uStack_450._4_4_);
        auVar27._0_4_ = -(uint)(1.0 < (float)uStack_450);
        auVar27._8_4_ = -(uint)(1.0 < (float)local_448[0]._0_4_);
        auVar27._12_4_ = -(uint)(1.0 < (float)local_448[0]._4_4_);
        iVar7 = movmskps(1,auVar27);
        if (iVar7 != 0) {
          if (((float)local_458._0_4_ == 1.0) && (!NAN((float)local_458._0_4_))) {
            iVar7 = getClampedRoundedTessLevel(SVar1,1.1);
            local_458._0_4_ = (float)iVar7;
          }
          if (((float)local_458._4_4_ == 1.0) && (!NAN((float)local_458._4_4_))) {
            iVar7 = getClampedRoundedTessLevel(SVar1,1.1);
            local_458._4_4_ = (float)iVar7;
          }
        }
      }
      if (pTVar17 == pTVar23) {
        __n_01 = (long)pTVar23 - (long)local_570;
        if (__n_01 == 0x7ffffffffffffff8) {
          tessLevelCases.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_start = local_570;
          tessLevelCases.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_finish = pTVar17;
          tessLevelCases.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar23;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)__n_01 / 0x18);
        __n_00 = (long)__n_01 % 0x18;
        pTVar17 = __p;
        if (pTVar23 == local_570) {
          pTVar17 = (pointer)0x1;
        }
        uVar26 = (long)__p->inner + (long)pTVar17->inner;
        if (0x555555555555554 < uVar26) {
          uVar26 = 0x555555555555555;
        }
        if (CARRY8((ulong)pTVar17,(ulong)__p)) {
          uVar26 = 0x555555555555555;
        }
        if (uVar26 == 0) {
          __dest = (pointer)0x0;
        }
        else {
          __dest = (pointer)operator_new(uVar26 * 0x18);
          __n_00 = extraout_RDX;
        }
        *(undefined8 *)((long)__dest + __n_01 + 0x10) = local_448[0]._M_allocated_capacity;
        *(undefined8 *)((long)__dest + __n_01) = local_458;
        ((undefined8 *)((long)__dest + __n_01))[1] = uStack_450;
        if (0 < (long)__n_01) {
          memmove(__dest,local_570,__n_01);
          __n_00 = extraout_RDX_00;
        }
        pTVar17 = (pointer)(__n_01 + (long)__dest);
        std::
        _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
        ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                         *)local_570,__p,__n_00);
        pTVar23 = __dest + uVar26;
        local_570 = __dest;
      }
      else {
        *(undefined8 *)((long)pTVar17->outer + 8) = local_448[0]._M_allocated_capacity;
        (((_Vector_impl *)pTVar17->inner)->super__Vector_impl_data)._M_start = (pointer)local_458;
        *(pointer *)pTVar17->outer = uStack_450;
      }
      pTVar17 = pTVar17 + 1;
    }
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = local_570;
    tessLevelCases.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar23;
  }
  __n = ((long)pTVar17 - (long)local_570) / 0x18;
  tessLevelCases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  ._M_impl.super__Vector_impl_data._M_finish = pTVar17;
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector(&caseReferences,__n,(allocator_type *)local_458);
  lVar22 = 0;
  iVar7 = (int)__n;
  uVar26 = 0;
  if (0 < iVar7) {
    uVar26 = __n & 0xffffffff;
  }
  for (; uVar26 * 0x18 - lVar22 != 0; lVar22 = lVar22 + 0x18) {
    TVar24 = this->m_primitiveType;
    SVar1 = this->m_spacing;
    outerLevels = (float *)((long)local_570->outer + lVar22);
    bVar5 = isPatchDiscarded(TVar24,outerLevels);
    if (bVar5) {
LAB_004078a1:
      local_458 = (undefined1  [8])0x0;
      uStack_450 = (pointer)0x0;
      local_448[0]._M_allocated_capacity = (pointer)0x0;
    }
    else if (TVar24 == TESSPRIMITIVETYPE_ISOLINES) {
      getClampedRoundedIsolineTessLevels(SVar1,outerLevels,outer);
      generateReferenceIsolineTessCoords
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_458
                 ,outer[0],outer[1]);
    }
    else {
      innerSrc = (float *)((long)&(((_Vector_impl *)local_570->inner)->super__Vector_impl_data).
                                  _M_start + lVar22);
      if (TVar24 == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(SVar1,innerSrc,outerLevels,&inner,outer);
        uVar25 = outer._0_8_ & 0xffffffff;
        generateReferenceQuadTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   local_458,SVar1,inner,local_294,outer[0],outer[1],outer[2],local_1fc);
      }
      else {
        if (TVar24 != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_004078a1;
        getClampedRoundedTriangleTessLevels(SVar1,innerSrc,outerLevels,&inner,outer);
        uVar25 = (ulong)(uint)outer[1];
        generateReferenceTriangleTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   local_458,SVar1,inner,outer[0],outer[1],outer[2]);
      }
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::_M_move_assign
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               ((long)&((caseReferences.
                         super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar22),
               (_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               local_458);
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               local_458);
  }
  pvVar21 = caseReferences.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar19 = caseReferences.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = caseReferences.
           super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    while (pvVar19 = pvVar21, pvVar21 = pvVar3 + 1,
          pvVar21 !=
          caseReferences.
          super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      uVar25 = (long)pvVar3[1].
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar21->
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = pvVar21;
      if (uVar25 <= (ulong)((long)(pvVar19->
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar19->
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)) {
        pvVar21 = pvVar19;
      }
    }
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&tfHandler,((this->super_TestCase).m_context)->m_renderCtx,
             (int)(((long)(pvVar19->
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar19->
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0xc));
  (**(code **)(lVar16 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar16 + 0x1680))(dVar8);
  (**(code **)(lVar16 + 0xfd8))(0x8e72,1);
  local_568 = 0;
  lVar22 = 0;
  do {
    TVar24 = (TessPrimitiveType)uVar25;
    if (iVar7 <= lVar22) {
      description = "Pass";
LAB_00408153:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(lVar22 < iVar7),description);
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler(&tfHandler);
      std::
      vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ::~vector(&caseReferences);
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
      ::~_Vector_base(&tessLevelCases.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                     );
      return STOP;
    }
    local_458 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
    std::operator<<((ostream *)&uStack_450,"Tessellation levels: ");
    (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)outer,
               (_anonymous_namespace_ *)
               ((long)&(((_Vector_impl *)local_570->inner)->super__Vector_impl_data)._M_start +
               local_568),(float *)((long)local_570->outer + local_568),
               (float *)(ulong)this->m_primitiveType,TVar24);
    std::operator<<((ostream *)&uStack_450,(string *)outer);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)outer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_450);
    (**(code **)(lVar16 + 0x14e0))
              (*(undefined4 *)
                ((long)&(((_Vector_impl *)local_570->inner)->super__Vector_impl_data)._M_start +
                local_568),uVar9);
    (**(code **)(lVar16 + 0x14e0))
              (*(undefined4 *)
                ((long)&(((_Vector_impl *)local_570->inner)->super__Vector_impl_data)._M_start +
                local_568 + 4),uVar10);
    (**(code **)(lVar16 + 0x14e0))(*(undefined4 *)((long)local_570->outer + local_568),uVar11);
    (**(code **)(lVar16 + 0x14e0))(*(undefined4 *)((long)local_570->outer + local_568 + 4),uVar12);
    (**(code **)(lVar16 + 0x14e0))(*(undefined4 *)((long)local_570->outer + local_568 + 8),uVar13);
    (**(code **)(lVar16 + 0x14e0))(*(undefined4 *)((long)local_570->outer + local_568 + 0xc),uVar14)
    ;
    err = (**(code **)(lVar16 + 0x800))();
    glu::checkError(err,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x81e);
    pvVar3 = caseReferences.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
              (&tfResult,&tfHandler,dVar8,0,0,(VertexArrayBinding *)0x0,1);
    iVar4 = tfResult.numPrimitives;
    iVar15 = (int)((*(long *)((long)&(pvVar3->
                                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + local_568) -
                   *(long *)((long)&(pvVar3->
                                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + local_568)) / 0xc);
    if (tfResult.numPrimitives == iVar15) {
      local_458 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
      std::operator<<((ostream *)&uStack_450,
                      "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ");
      std::ostream::operator<<((ostringstream *)&uStack_450,tfResult.numPrimitives);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_450);
    }
    else {
      local_458 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
      std::operator<<((ostream *)&uStack_450,
                      "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ");
      std::ostream::operator<<((ostringstream *)&uStack_450,tfResult.numPrimitives);
      std::operator<<((ostream *)&uStack_450,", reference value is ");
      std::ostream::_M_insert<unsigned_long>((ulong)&uStack_450);
      std::operator<<((ostream *)&uStack_450," (logging further info anyway)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_450);
    }
    if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
      local_458 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
      std::operator<<((ostream *)&uStack_450,
                      "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00407df2:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_450);
    }
    else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      local_458 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
      std::operator<<((ostream *)&uStack_450,
                      "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00407df2;
    }
    TVar24 = this->m_primitiveType;
    tcu::Surface::Surface(&refVisual);
    tcu::Surface::Surface(&resVisual);
    coords = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             ((long)&(pvVar3->
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_568);
    drawTessCoordVisualization(&refVisual,TVar24,coords);
    drawTessCoordVisualization(&resVisual,TVar24,&tfResult.varying);
    local_458._0_4_ = 0xffff0000;
    bVar5 = oneWayComparePointSets
                      ((TestLog *)log,&refVisual,TVar24,coords,&tfResult.varying,"reference",
                       "result",(RGBA *)local_458);
    local_458._0_4_ = 0xff0000ff;
    bVar6 = oneWayComparePointSets
                      ((TestLog *)log,&resVisual,TVar24,&tfResult.varying,coords,"result",
                       "reference",(RGBA *)local_458);
    this_00 = (ostringstream *)(outer + 2);
    if (!bVar5 || !bVar6) {
      outer._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                     );
      pTVar17 = (pointer)tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)outer,
                                    (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"RefTessCoordVisualization",&local_549);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"Reference tessCoord visualization",&local_54a);
      pSVar20 = &refVisual;
      tcu::LogImage::LogImage
                ((LogImage *)&inner,&local_2d8,&local_2b8,pSVar20,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&inner,(int)pTVar17,__buf,(size_t)pSVar20);
      local_458 = (undefined1  [8])pTVar17;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
      std::operator<<((ostream *)&uStack_450,
                      "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_450);
      tcu::LogImage::~LogImage((LogImage *)&inner);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)outer,"ResTessCoordVisualization",(allocator<char> *)&local_2d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inner,"Result tessCoord visualization",(allocator<char> *)&local_2b8);
    pSVar20 = &resVisual;
    uVar25 = 2;
    tcu::LogImage::LogImage
              ((LogImage *)local_458,(string *)outer,(string *)&inner,pSVar20,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_458,(int)log,__buf_00,(size_t)pSVar20);
    tcu::LogImage::~LogImage((LogImage *)local_458);
    std::__cxx11::string::~string((string *)&inner);
    std::__cxx11::string::~string((string *)outer);
    tcu::Surface::~Surface(&resVisual);
    tcu::Surface::~Surface(&refVisual);
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              (&tfResult.varying.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
    if ((!bVar5 || !bVar6) || iVar4 != iVar15) {
      description = "Invalid tessellation coordinates";
      goto LAB_00408153;
    }
    local_458 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_450);
    std::operator<<((ostream *)&uStack_450,"All OK");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_450);
    lVar22 = lVar22 + 1;
    local_568 = local_568 + 0x18;
  } while( true );
}

Assistant:

TessCoordCase::IterateResult TessCoordCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelInner0Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner0");
	const int						tessLevelInner1Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner1");
	const int						tessLevelOuter0Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter0");
	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");
	const int						tessLevelOuter2Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter2");
	const int						tessLevelOuter3Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter3");

	const vector<TessLevels>		tessLevelCases				= genTessLevelCases();
	vector<vector<Vec3> >			caseReferences				(tessLevelCases.size());

	for (int i = 0; i < (int)tessLevelCases.size(); i++)
		caseReferences[i] = generateReferenceTessCoords(m_primitiveType, m_spacing, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const int						maxNumVertices				= (int)std::max_element(caseReferences.begin(), caseReferences.end(), SizeLessThan<vector<Vec3> >())->size();
	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float* const innerLevels = &tessLevelCases[tessLevelCaseNdx].inner[0];
		const float* const outerLevels = &tessLevelCases[tessLevelCaseNdx].outer[0];

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels, m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(tessLevelInner0Loc, innerLevels[0]);
		gl.uniform1f(tessLevelInner1Loc, innerLevels[1]);
		gl.uniform1f(tessLevelOuter0Loc, outerLevels[0]);
		gl.uniform1f(tessLevelOuter1Loc, outerLevels[1]);
		gl.uniform1f(tessLevelOuter2Loc, outerLevels[2]);
		gl.uniform1f(tessLevelOuter3Loc, outerLevels[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const vector<Vec3>&			tessCoordsRef	= caseReferences[tessLevelCaseNdx];
			const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);

			if (tfResult.numPrimitives != (int)tessCoordsRef.size())
			{
				log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
										<< tfResult.numPrimitives << ", reference value is " << tessCoordsRef.size()
										<< " (logging further info anyway)" << TestLog::EndMessage;
				success = false;
			}
			else
				log << TestLog::Message << "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be " << tfResult.numPrimitives << TestLog::EndMessage;

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << TestLog::EndMessage;
			else
				DE_ASSERT(false);

			success = compareTessCoords(log, m_primitiveType, tessCoordsRef, tfResult.varying) && success;
		}

		if (!success)
			break;
		else
			log << TestLog::Message << "All OK" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}